

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall wabt::WastParser::ErrorUnlessOpcodeEnabled(WastParser *this,Token *token)

{
  bool bVar1;
  char *format;
  Opcode local_1c;
  Token *pTStack_18;
  Opcode opcode;
  Token *token_local;
  WastParser *this_local;
  
  pTStack_18 = token;
  local_1c = Token::opcode(token);
  bVar1 = Opcode::IsEnabled(&local_1c,&this->options_->features);
  if (!bVar1) {
    format = Opcode::GetName(&local_1c);
    Error(this,0x19b4d4c,format);
  }
  return;
}

Assistant:

void WastParser::ErrorUnlessOpcodeEnabled(const Token& token) {
  Opcode opcode = token.opcode();
  if (!opcode.IsEnabled(options_->features)) {
    Error(token.loc, "opcode not allowed: %s", opcode.GetName());
  }
}